

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O0

bool operator<(summary_period *lhs,summary_period *rhs)

{
  summary_period *rhs_local;
  summary_period *lhs_local;
  
  if (lhs->summary_id == rhs->summary_id) {
    if (lhs->period_no == rhs->period_no) {
      lhs_local._7_1_ = lhs->fileindex < rhs->fileindex;
    }
    else {
      lhs_local._7_1_ = lhs->period_no < rhs->period_no;
    }
  }
  else {
    lhs_local._7_1_ = lhs->summary_id < rhs->summary_id;
  }
  return lhs_local._7_1_;
}

Assistant:

bool operator<(const summary_period &lhs, const summary_period &rhs) {

	if (lhs.summary_id != rhs.summary_id) {
		return lhs.summary_id < rhs.summary_id;
	} else if (lhs.period_no != rhs.period_no) {
		return lhs.period_no < rhs.period_no;
	} else {
		return lhs.fileindex < rhs.fileindex;
	}

}